

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ex_display_options.c
# Opt level: O1

int main(int argc,char **argv)

{
  ALLEGRO_FONT *pAVar1;
  char cVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  int extraout_EAX;
  undefined4 uVar6;
  ALLEGRO_DISPLAY *display;
  undefined8 uVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  ALLEGRO_DISPLAY *pAVar10;
  long lVar11;
  char **ppcVar12;
  int i;
  uint uVar13;
  ulong uVar14;
  int *piVar15;
  char *pcVar16;
  int iVar17;
  bool bVar18;
  undefined4 uVar19;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  undefined4 extraout_XMM0_Dc_02;
  undefined4 uVar20;
  undefined4 uVar21;
  undefined4 uVar22;
  undefined4 uVar23;
  float fVar24;
  undefined4 uVar25;
  ALLEGRO_EVENT event;
  undefined4 uStack_f8;
  ulong uStack_f4;
  undefined4 uStack_ec;
  int iStack_e8;
  float fStack_e4;
  float fStack_e0;
  float fStack_dc;
  ulong uStack_d8;
  ulong uStack_d0;
  char *pcStack_c8;
  undefined4 local_88;
  undefined4 local_84;
  int local_78 [8];
  uint local_58;
  int local_54;
  int local_38;
  
  cVar2 = al_install_system(0x5020700,atexit);
  if (cVar2 == '\0') {
    pcVar16 = "Could not init Allegro.\n";
  }
  else {
    ppcVar12 = flag_names;
    uVar14 = 0;
    piVar15 = &DAT_00104354;
    do {
      if ((uVar14 < 0xb) && ((0x677U >> ((uint)uVar14 & 0x1f) & 1) != 0)) {
        *ppcVar12 = (char *)((long)&DAT_00104354 + (long)*piVar15);
      }
      uVar14 = uVar14 + 1;
      piVar15 = piVar15 + 1;
      ppcVar12 = ppcVar12 + 1;
    } while (uVar14 != 0x20);
    al_init_primitives_addon();
    uVar20 = 0x3f800000;
    fVar24 = 0.0;
    uVar7 = al_map_rgba_f(0x3f800000,0x3f800000,0x3f800000,0x3f800000);
    white.b = (float)uVar20;
    white.r = (float)(int)uVar7;
    white.g = (float)(int)((ulong)uVar7 >> 0x20);
    white.a = fVar24;
    al_install_keyboard();
    al_install_mouse();
    al_init_font_addon();
    display = (ALLEGRO_DISPLAY *)al_create_display(800,600);
    if (display != (ALLEGRO_DISPLAY *)0x0) {
      load_font();
      uVar7 = al_create_timer(0x11111111);
      modes_count = al_get_num_display_modes();
      options_count = 0x18;
      uVar8 = al_get_current_display();
      iVar3 = al_get_display_height(uVar8);
      visible_rows = iVar3 / font_h + -10;
      al_map_rgb_f(0x3f800000,0x3f800000,0x3f800000);
      al_clear_to_color();
      display_options(display);
      al_flip_display();
      uVar8 = al_create_event_queue();
      uVar9 = al_get_keyboard_event_source();
      al_register_event_source(uVar8,uVar9);
      uVar9 = al_get_mouse_event_source();
      al_register_event_source(uVar8,uVar9);
      uVar9 = al_get_display_event_source(display);
      al_register_event_source(uVar8,uVar9);
      uVar9 = al_get_timer_event_source(uVar7);
      al_register_event_source(uVar8,uVar9);
      al_start_timer(uVar7);
      bVar18 = false;
      do {
        al_wait_for_event(uVar8,local_78);
        iVar3 = 3;
        if (local_78[0] != 0x2a) {
          if ((local_78[0] == 0x15) && (local_38 == 1)) {
            iVar4 = al_get_display_width(display);
            iVar3 = (local_54 + -10) / font_h;
            iVar17 = iVar3 + -1;
            iVar4 = (int)local_58 / (iVar4 / 2);
            if ((iVar4 == 0) && ((0 < iVar3 && (iVar17 <= modes_count)))) {
              selected_column = 0;
              bVar18 = true;
              selected_mode = iVar17;
            }
            if (((iVar4 == 1) && (0 < iVar3)) && (iVar3 <= options_count)) {
              selected_column = 1;
              bVar18 = true;
              selected_option = iVar17;
            }
          }
          if ((local_78[0] == 0x1e) && (uVar5 = al_get_display_flags(display), uVar5 != flags)) {
            old_flags = old_flags | uVar5;
            bVar18 = true;
            flags = uVar5;
          }
          uVar5 = local_58;
          if (local_78[0] == 0xb) {
            iVar3 = 3;
            if (local_58 != 0x3b) {
              if ((local_58 & 0xfffffffe) == 0x52) {
                bVar18 = true;
                selected_column = (int)(local_58 == 0x53);
              }
              if (local_58 == 0x54) {
                bVar18 = true;
                piVar15 = &selected_mode;
                if (selected_column != 0) {
                  if (selected_column != 1) goto LAB_001027bc;
                  piVar15 = &selected_option;
                }
                *piVar15 = *piVar15 + -1;
              }
LAB_001027bc:
              if (local_58 == 0x55) {
                bVar18 = true;
                piVar15 = &selected_mode;
                if (selected_column != 0) {
                  if (selected_column != 1) goto LAB_001027e3;
                  piVar15 = &selected_option;
                }
                *piVar15 = *piVar15 + 1;
              }
LAB_001027e3:
              if (local_58 == 0x43) {
                if (selected_column == 0) {
                  if (selected_mode < 2) {
                    local_88 = 800;
                    if (selected_mode == 1) {
                      local_84 = 600;
                      uVar7 = 0x200;
                    }
                    else {
                      local_84 = 600;
                      uVar7 = 1;
                    }
                  }
                  else {
                    al_get_display_mode(selected_mode + -2,&local_88);
                    uVar7 = 2;
                  }
                  al_set_new_display_flags(uVar7);
                  al_destroy_font(font);
                  font = (ALLEGRO_FONT *)0x0;
                  pAVar10 = (ALLEGRO_DISPLAY *)al_create_display(local_88,local_84);
                  if (pAVar10 == (ALLEGRO_DISPLAY *)0x0) {
                    builtin_strncpy(status + 0x10," failed.",9);
                  }
                  else {
                    al_destroy_display(display);
                    al_set_target_backbuffer(pAVar10);
                    uVar7 = al_get_display_event_source(pAVar10);
                    al_register_event_source(uVar8,uVar7);
                    uVar7 = al_get_current_display();
                    iVar3 = al_get_display_height(uVar7);
                    visible_rows = iVar3 / font_h + -10;
                    builtin_strncpy(status + 0x10," succeeded.",0xc);
                    display = pAVar10;
                  }
                  builtin_strncpy(status,"Display creation",0x10);
                  load_font();
                }
                bVar18 = true;
                if (selected_column == 1) {
                  lVar11 = (long)selected_option;
                  options[lVar11].required =
                       ((options[lVar11].required + 1) / 3) * -3 + options[lVar11].required + 1;
                  al_set_new_display_option(options[lVar11].option,options[lVar11].value);
                }
              }
              iVar3 = 0;
              if (((local_58 & 0xfffffffe) == 0x50) && (selected_column == 1)) {
                uVar13 = (uint)(local_58 == 0x50);
                if (local_58 == 0x51) {
                  uVar13 = 0xffffffff;
                }
                lVar11 = (long)selected_option;
                iVar4 = uVar13 + options[lVar11].value;
                if (iVar4 < 1) {
                  iVar4 = 0;
                }
                options[lVar11].value = iVar4;
                if (options[lVar11].max_value < iVar4) {
                  options[lVar11].value = options[lVar11].max_value;
                }
                al_set_new_display_option
                          (options[lVar11].option,options[lVar11].value,options[lVar11].required);
                bVar18 = true;
              }
            }
            if (uVar5 == 0x3b) goto LAB_00102a83;
          }
          if (selected_mode < 0) {
            selected_mode = 0;
          }
          if (modes_count + 1 < selected_mode) {
            selected_mode = modes_count + 1;
          }
          if (selected_option < 0) {
            selected_option = 0;
          }
          if (options_count <= selected_option) {
            selected_option = options_count + -1;
          }
          if (selected_mode < first_visible_row) {
            first_visible_row = selected_mode;
          }
          if (first_visible_row + visible_rows <= selected_mode) {
            first_visible_row = (selected_mode - visible_rows) + 1;
          }
          iVar3 = 0;
          if ((bVar18) && (cVar2 = al_is_event_queue_empty(uVar8), cVar2 != '\0')) {
            al_map_rgb_f(0x3f800000,0x3f800000,0x3f800000);
            al_clear_to_color();
            display_options(display);
            al_flip_display();
            iVar3 = 0;
            bVar18 = false;
          }
        }
LAB_00102a83:
        if (iVar3 != 0) {
          al_destroy_font(font);
          return 0;
        }
      } while( true );
    }
    pcVar16 = "Could not create display.\n";
  }
  abort_example(pcVar16);
  font = (ALLEGRO_FONT *)al_create_builtin_font();
  if (font != (ALLEGRO_FONT *)0x0) {
    font_h = al_get_font_line_height(font);
    return extraout_EAX;
  }
  pcVar16 = "Error creating builtin font\n";
  abort_example("Error creating builtin font\n");
  uStack_d0 = (ulong)(uint)options_count;
  iVar3 = al_get_display_width();
  pcStack_c8 = pcVar16;
  iStack_e8 = al_get_display_height(pcVar16);
  modes_count = al_get_num_display_modes();
  al_map_rgb_f(0x3f4ccccd,0x3f4ccccd,0x3f800000);
  al_draw_textf(font,0,"Create new display");
  if (first_visible_row < modes_count + 2) {
    iVar17 = font_h + 10;
    iVar4 = first_visible_row;
    do {
      if (visible_rows + first_visible_row <= iVar4) break;
      if (iVar4 < 2) {
        uStack_f8 = 800;
        uStack_f4 = 600;
        uStack_ec = 0;
      }
      else {
        al_get_display_mode(iVar4 + -2,&uStack_f8);
      }
      if ((selected_column == 0) && (iVar4 == selected_mode)) {
        uVar21 = 0x3f800000;
        uVar20 = al_map_rgb_f(0x3f800000,0x3f800000,0);
        al_set_blender(0,1,0);
        al_draw_filled_rectangle
                  (0x41200000,(float)iVar17,0x439b0000,(float)(font_h + iVar17),uVar20,uVar21);
      }
      uVar22 = 0;
      uVar25 = 0;
      uVar21 = al_map_rgb_f(0,0,0);
      uVar20 = extraout_XMM0_Dc;
      al_set_blender(0,1,3);
      if ((iVar4 < 1 || iVar4 != first_visible_row) &&
         ((iVar4 != first_visible_row + visible_rows + -1 || (modes_count < iVar4)))) {
        pcVar16 = "FS Window";
        if (iVar4 == 0) {
          pcVar16 = "Windowed";
        }
        if (1 < iVar4) {
          pcVar16 = "Fullscreen";
        }
        al_draw_textf(uVar21,uVar22,0x41200000,(float)iVar17,font,0,"%s %d x %d (fmt: %x, %d Hz)",
                      pcVar16,uStack_f8,uStack_f4 & 0xffffffff,uStack_f4 >> 0x20,uStack_ec,uVar22,
                      uVar25,uVar21,uVar20);
      }
      else {
        al_draw_textf(uVar21,uVar22,0x41200000,(float)iVar17,font,0,"...");
      }
      iVar17 = iVar17 + font_h;
      bVar18 = iVar4 <= modes_count;
      iVar4 = iVar4 + 1;
    } while (bVar18);
  }
  uStack_d8 = (ulong)(uint)(iVar3 / 2);
  uVar22 = 0x3f4ccccd;
  uVar25 = 0;
  uVar21 = al_map_rgb_f(0x3f4ccccd,0x3f4ccccd,0x3f800000);
  fVar24 = (float)(int)(iVar3 / 2 + 10);
  uVar20 = extraout_XMM0_Dc_00;
  al_draw_textf(font,0,"Options for new display");
  fStack_e0 = (float)(iVar3 + -10);
  al_draw_textf(uVar21,uVar22,fStack_e0,0x41200000,font,2,"(current display)");
  if (0 < (int)uStack_d0) {
    fStack_e4 = (float)((int)uStack_d8 + 0x136);
    iVar3 = font_h + 10;
    piVar15 = &options[0].required;
    uVar14 = 0;
    do {
      if ((selected_column == 1) && (uVar14 == (uint)selected_option)) {
        uVar22 = 0x3f800000;
        uVar25 = 0;
        uVar21 = al_map_rgb_f(0x3f800000,0x3f800000,0);
        uVar20 = extraout_XMM0_Dc_01;
        al_draw_filled_rectangle(fVar24,(float)iVar3,fStack_e4,(float)(font_h + iVar3));
      }
      iVar4 = *piVar15;
      uVar19 = 0x3f000000;
      uVar6 = uVar21;
      if (iVar4 == 0) {
        uVar23 = 0x3f000000;
        uVar21 = 0x3f000000;
LAB_00102ed2:
        uVar21 = al_map_rgb_f(uVar19,uVar23,uVar21);
      }
      else {
        if (iVar4 == 2) {
          uVar19 = 0;
          uVar23 = 0;
          uVar21 = 0;
          goto LAB_00102ed2;
        }
        uVar23 = uVar22;
        if (iVar4 == 1) {
          uVar23 = 0;
          uVar21 = 0;
          uVar19 = 0x3f000000;
          goto LAB_00102ed2;
        }
      }
      fStack_dc = (float)iVar3;
      pcVar16 = "ignored";
      if (*piVar15 == 2) {
        pcVar16 = "suggested";
      }
      if (*piVar15 == 1) {
        pcVar16 = "required";
      }
      al_draw_textf(uVar21,uVar23,fVar24,font,0,"%s: %d (%s)",
                    ((anon_struct_24_5_b24d3c67 *)(piVar15 + -5))->name,piVar15[-2],pcVar16,uVar6,
                    uVar20,uVar22,uVar25);
      uVar22 = 0x3f000000;
      uVar25 = 0;
      uVar21 = al_map_rgb_f(0x3f666666,0x3f000000,0x3e99999a);
      pAVar1 = font;
      uVar20 = extraout_XMM0_Dc_02;
      uVar6 = al_get_display_option(pcStack_c8,piVar15[-3]);
      al_draw_textf(uVar21,uVar22,fStack_e0,fStack_dc,pAVar1,2,"%d",uVar6);
      iVar3 = iVar3 + font_h;
      uVar14 = uVar14 + 1;
      piVar15 = piVar15 + 6;
    } while (uStack_d0 != uVar14);
  }
  uVar21 = 0;
  uVar20 = al_map_rgb_f(0,0,0x3f4ccccd);
  iVar3 = iStack_e8 + font_h * -2;
  lVar11 = 0;
  al_draw_textf(font,0,"PageUp/Down: modify values");
  iVar3 = (iVar3 + -10) - font_h;
  al_draw_textf(uVar20,uVar21,0x41200000,(float)iVar3,font,0,"Return: set mode or require option");
  al_draw_textf(uVar20,uVar21,0x41200000,(float)(iVar3 - font_h),font,0,
                "Cursor keys: change selection");
  ppcVar12 = flag_names;
  do {
    if (*ppcVar12 != (char *)0x0) {
      if (((uint)flags >> ((uint)lVar11 & 0x1f) & 1) == 0) {
        if ((old_flags & 1 << ((byte)lVar11 & 0x1f)) == 0) goto LAB_0010310c;
        uVar20 = 0x3ecccccd;
        uVar21 = 0x3ecccccd;
      }
      else {
        uVar20 = 0;
        uVar21 = 0;
      }
      al_map_rgb_f(0x3f000000,uVar20,uVar21);
      al_draw_text(font,0,*ppcVar12);
      al_get_text_width(font);
    }
LAB_0010310c:
    lVar11 = lVar11 + 1;
    ppcVar12 = ppcVar12 + 1;
    if (lVar11 == 0x20) {
      al_map_rgb_f(0x3f800000,0,0);
      iVar3 = al_draw_text(font,1,status);
      return iVar3;
    }
  } while( true );
}

Assistant:

int main(int argc, char **argv)
{
   ALLEGRO_DISPLAY *display;
   ALLEGRO_EVENT_QUEUE *queue;
   ALLEGRO_TIMER *timer;
   bool redraw = false;

   (void)argc;
   (void)argv;

   if (!al_init()) {
      abort_example("Could not init Allegro.\n");
   }
   init_flags();
   al_init_primitives_addon();
   
   white = al_map_rgba_f(1, 1, 1, 1);

   al_install_keyboard();
   al_install_mouse();
   al_init_font_addon();

   display = al_create_display(800, 600);
   if (!display) {
      abort_example("Could not create display.\n");
   }

   load_font();

   timer = al_create_timer(1.0 / 60);

   modes_count = al_get_num_display_modes();
   options_count = sizeof(options) / sizeof(options[0]);
   
   update_ui();
   
   al_clear_to_color(al_map_rgb_f(1, 1, 1));
   display_options(display);
   al_flip_display();

   queue = al_create_event_queue();
   al_register_event_source(queue, al_get_keyboard_event_source());
   al_register_event_source(queue, al_get_mouse_event_source());
   al_register_event_source(queue, al_get_display_event_source(display));
   al_register_event_source(queue, al_get_timer_event_source(timer));
   
   al_start_timer(timer);

   while (1) {
      ALLEGRO_EVENT event;
      al_wait_for_event(queue, &event);
      if (event.type == ALLEGRO_EVENT_DISPLAY_CLOSE) {
         break;
      }
      if (event.type == ALLEGRO_EVENT_MOUSE_BUTTON_DOWN) {
         if (event.mouse.button == 1) {
            int dw = al_get_display_width(display);
            int y = 10;
            int row = (event.mouse.y - y) / font_h - 1;
            int column = event.mouse.x / (dw / 2);
            if (column == 0) {
               if (row >= 0 && row <= modes_count) {
                  selected_column = column;
                  selected_mode = row;
                  redraw = true;
               }
            }
            if (column == 1) {
               if (row >= 0 && row < options_count) {
                  selected_column = column;
                  selected_option = row;
                  redraw = true;
               }
            }
         }
      }
      if (event.type == ALLEGRO_EVENT_TIMER) {
          int f = al_get_display_flags(display);
          if (f != flags) {
              redraw = true;
              flags = f;
              old_flags |= f;
          }
      }
      if (event.type == ALLEGRO_EVENT_KEY_CHAR) {
         int change;
         if (event.keyboard.keycode == ALLEGRO_KEY_ESCAPE)
            break;
         if (event.keyboard.keycode == ALLEGRO_KEY_LEFT) {
            selected_column = 0;
            redraw = true;
         }
         if (event.keyboard.keycode == ALLEGRO_KEY_RIGHT) {
            selected_column = 1;
            redraw = true;
         }
         if (event.keyboard.keycode == ALLEGRO_KEY_UP) {
            if (selected_column == 0) selected_mode -= 1;
            if (selected_column == 1) selected_option -= 1;
            redraw = true;
         }
         if (event.keyboard.keycode == ALLEGRO_KEY_DOWN) {
            if (selected_column == 0) selected_mode += 1;
            if (selected_column == 1) selected_option += 1;
            redraw = true;
         }
         if (event.keyboard.keycode == ALLEGRO_KEY_ENTER) {
             if (selected_column == 0) {
                ALLEGRO_DISPLAY_MODE mode;
                ALLEGRO_DISPLAY *new_display;
                if (selected_mode > 1) {
                    al_get_display_mode(selected_mode - 2, &mode);
                    al_set_new_display_flags(ALLEGRO_FULLSCREEN);
                }
                else if (selected_mode == 1) {
                    mode.width = 800;
                    mode.height = 600;
                    al_set_new_display_flags(ALLEGRO_FULLSCREEN_WINDOW);
                }
                else {
                    mode.width = 800;
                    mode.height = 600;
                    al_set_new_display_flags(ALLEGRO_WINDOWED);
                }

                al_destroy_font(font);
                font = NULL;

                new_display = al_create_display(
                   mode.width, mode.height);
                if (new_display) {
                   al_destroy_display(display);
                   display = new_display;
                   al_set_target_backbuffer(display);
                   al_register_event_source(queue,
                      al_get_display_event_source(display));
                   update_ui();
                   sprintf(status, "Display creation succeeded.");
                }
                else {
                   sprintf(status, "Display creation failed.");
                }

                load_font();
             }
             if (selected_column == 1) {
                 options[selected_option].required += 1;
                 options[selected_option].required %= 3;
                 al_set_new_display_option(
                    options[selected_option].option,
                    options[selected_option].value,
                    options[selected_option].required);
             }
             redraw = true;
         }
         change = 0;
         if (event.keyboard.keycode == ALLEGRO_KEY_PGUP) change = 1;
         if (event.keyboard.keycode == ALLEGRO_KEY_PGDN) change = -1;
         if (change && selected_column == 1) {
            options[selected_option].value += change;
            if (options[selected_option].value < 0)
               options[selected_option].value = 0;
            if (options[selected_option].value >
               options[selected_option].max_value)
               options[selected_option].value =
                  options[selected_option].max_value;
            al_set_new_display_option(options[selected_option].option,
               options[selected_option].value,
               options[selected_option].required);
            redraw = true;
         }
      }
      
      if (selected_mode < 0) selected_mode = 0;
      if (selected_mode > modes_count + 1)
         selected_mode = modes_count + 1;
      if (selected_option < 0) selected_option = 0;
      if (selected_option >= options_count)
         selected_option = options_count - 1;
      if (selected_mode < first_visible_row)
         first_visible_row = selected_mode;
      if (selected_mode > first_visible_row + visible_rows - 1)
         first_visible_row = selected_mode - visible_rows + 1;

      if (redraw && al_is_event_queue_empty(queue)) {
         redraw = false;
         al_clear_to_color(al_map_rgb_f(1, 1, 1));
         display_options(display);
         al_flip_display();
      }
   }

   al_destroy_font(font);

   return 0;
}